

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O1

size_t __thiscall proto3_unittest::TestOneof2::ByteSizeLong(TestOneof2 *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  
  if ((this->field_0)._impl_._oneof_case_[0] == 6) {
    uVar2 = (long)(this->field_0)._impl_.foo_.foo_enum_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  else {
    sVar3 = 0;
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestOneof2::ByteSizeLong() const {
  const TestOneof2& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_unittest.TestOneof2)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  switch (this_.foo_case()) {
    // .proto3_unittest.TestOneof2.NestedEnum foo_enum = 6;
    case kFooEnum: {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_foo_enum());
      break;
    }
    case FOO_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}